

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::write<char>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,basic_string_view<char> s,
          format_specs *specs)

{
  basic_string_view<char> s_00;
  type tVar1;
  char *s_01;
  size_t size_00;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *in_RCX;
  format_specs *in_RDX;
  size_t in_RDI;
  size_t size;
  char *data;
  format_specs *in_stack_ffffffffffffffc8;
  basic_string_view<char> bStack_10;
  
  bStack_10.size_ = (size_t)in_RDX;
  s_01 = basic_string_view<char>::data(&bStack_10);
  size_00 = basic_string_view<char>::size(&bStack_10);
  if (-1 < *(int *)((long)&(in_RCX->out_).container + 4)) {
    tVar1 = to_unsigned<int>(*(int *)((long)&(in_RCX->out_).container + 4));
    if (tVar1 < size_00) {
      to_unsigned<int>(*(int *)((long)&(in_RCX->out_).container + 4));
      s_00.size_ = in_RDI;
      s_00.data_ = (char *)in_RCX;
      size_00 = code_point_index(s_00,(size_t)s_01);
      in_stack_ffffffffffffffc8 = (format_specs *)bStack_10.size_;
    }
  }
  write<char>(in_RCX,s_01,size_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void write(basic_string_view<Char> s, const format_specs& specs = {}) {
    const Char* data = s.data();
    std::size_t size = s.size();
    if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
      size = code_point_index(s, to_unsigned(specs.precision));
    write(data, size, specs);
  }